

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> * __thiscall
kratos::GeneratorGraph::get_nodes
          (vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__return_storage_ptr__
          ,GeneratorGraph *this)

{
  bool bVar1;
  size_type __n;
  reference ppVar2;
  pair<kratos::Generator_*const,_kratos::GeneratorNode> *iter;
  iterator __end1;
  iterator __begin1;
  unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
  *__range1;
  GeneratorGraph *this_local;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *res;
  
  std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
            (__return_storage_ptr__);
  __n = std::
        unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
        ::size(&this->nodes_);
  std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = std::
           unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
           ::begin(&this->nodes_);
  iter = (pair<kratos::Generator_*const,_kratos::GeneratorNode> *)
         std::
         unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
         ::end(&this->nodes_);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false>
                            ,(_Node_iterator_base<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false>
                              *)&iter), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false,_false>
             ::operator*(&__end1);
    std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
    emplace_back<kratos::Generator*const&>
              ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
               __return_storage_ptr__,&(ppVar2->second).generator);
    std::__detail::
    _Node_iterator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false,_false>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Generator *> GeneratorGraph::get_nodes() {
    std::vector<Generator *> res;
    res.reserve(nodes_.size());
    for (auto const &iter : nodes_) {
        res.emplace_back(iter.second.generator);
    }

    return res;
}